

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicitEventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitEventControlSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Token openParen;
  Token star;
  Token closeParen;
  ImplicitEventControlSyntax *pIVar1;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Token *in_R8;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pIVar1 = (ImplicitEventControlSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  openParen.info = (Info *)pIVar1;
  openParen._0_8_ = in_stack_ffffffffffffff88;
  star.info = (Info *)*in_RDX;
  star._0_8_ = *(undefined8 *)(in_RCX + 8);
  closeParen.info = (Info *)*in_RSI;
  closeParen._0_8_ = in_RDX[1];
  slang::syntax::ImplicitEventControlSyntax::ImplicitEventControlSyntax
            ((ImplicitEventControlSyntax *)in_R8->info,*in_R8,openParen,star,closeParen);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }